

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_RequiresChainedFlags_Test::TestBody(TApp_RequiresChainedFlags_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *pOVar3;
  Option *pOVar4;
  long lVar5;
  allocator local_161;
  AssertHelper local_160;
  allocator local_151;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150 [4];
  string local_130 [32];
  string local_110 [32];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"--opt1",(allocator *)local_150);
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_160);
  this_00 = &(this->super_TApp).app;
  pOVar3 = CLI::App::add_flag(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_90,"--opt2",(allocator *)local_150);
  std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&local_160);
  pOVar4 = CLI::App::add_flag(this_00,&local_90,&local_b0);
  pOVar3 = CLI::Option::requires(pOVar4,pOVar3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_d0,"--opt3",(allocator *)local_150);
  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_160);
  pOVar4 = CLI::App::add_flag(this_00,&local_d0,&local_f0);
  CLI::Option::requires(pOVar4,pOVar3);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_150,"--opt1",(allocator *)&local_160);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_150,
             local_130);
  std::__cxx11::string::~string((string *)local_150);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_150,"--opt2",(allocator *)&local_160);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_150,
             local_130);
  std::__cxx11::string::~string((string *)local_150);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_150);
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x46b,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_150);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_150);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_150,"--opt3",(allocator *)&local_160);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_150,
             local_130);
  std::__cxx11::string::~string((string *)local_150);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_150);
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x46f,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_150);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_150);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_150,"--opt3",(allocator *)&local_160);
  std::__cxx11::string::string(local_130,"--opt2",&local_161);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_150,
             local_110);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_150[0].ptr_ + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_150);
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x473,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_150);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_150);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_150,"--opt3",(allocator *)&local_160);
  std::__cxx11::string::string(local_130,"--opt1",&local_161);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_150,
             local_110);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_150[0].ptr_ + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_150);
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x477,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_150);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_150);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_150,"--opt2",(allocator *)&local_160);
  std::__cxx11::string::string(local_130,"--opt1",&local_161);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_150,
             local_110);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_150[0].ptr_ + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_150,"--opt1",(allocator *)&local_160);
  std::__cxx11::string::string(local_130,"--opt2",&local_161);
  std::__cxx11::string::string(local_110,"--opt3",&local_151);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_150,
             &local_f0);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_150[0].ptr_ + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RequiresChainedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    CLI::Option *opt2 = app.add_flag("--opt2")->requires(opt1);
    app.add_flag("--opt3")->requires(opt2);

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3", "--opt2"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt2", "--opt1"};
    run();

    app.reset();
    args = {"--opt1", "--opt2", "--opt3"};
    run();
}